

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

int Bmc_CexVerify(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong local_50;
  
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  for (iVar10 = 0; iVar10 < p->nRegs; iVar10 = iVar10 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x40000000;
  }
  iVar10 = 0;
  local_50 = 0x4000000000000000;
  do {
    if (pCex->iFrame < iVar10) {
      pGVar4 = Gia_ManPo(p,pCex->iPo);
      return (uint)(((uint)*(undefined8 *)pGVar4 >> 0x1e & 1) == 0) &
             (uint)((ulong)*(undefined8 *)pGVar4 >> 0x3e);
    }
    for (iVar11 = 0; iVar11 < p->vCis->nSize - p->nRegs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManCi(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar8 = pCexCare->nPis * iVar10 + pCexCare->nRegs + iVar11;
      if (((uint)(&pCexCare[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) == 0) {
        uVar9 = *(ulong *)pGVar4 | 0x4000000040000000;
      }
      else {
        uVar8 = pCex->nPis * iVar10 + pCex->nRegs + iVar11;
        if (((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) == 0) {
          uVar9 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x40000000;
        }
        else {
          uVar9 = (*(ulong *)pGVar4 & 0xbfffffffbfffffff) + 0x4000000000000000;
        }
      }
      *(ulong *)pGVar4 = uVar9;
    }
    for (iVar11 = 0; iVar11 < p->nRegs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjIsRo(p,pGVar4);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = p->vCos->nSize;
      iVar1 = p->vCis->nSize;
      iVar3 = Gia_ObjCioId(pGVar4);
      pGVar5 = Gia_ManCo(p,(iVar2 - iVar1) + iVar3);
      iVar2 = Gia_ObjIsRo(p,pGVar4);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x355,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((*(ulong *)pGVar5 & 0x4000000040000000) == 0) {
        __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar6 = *(ulong *)pGVar5 & 0x40000000;
      uVar9 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar9 & 0xffffffffbfffffff | uVar6;
      *(ulong *)pGVar4 = uVar9 & 0xbfffffffbfffffff | uVar6 | *(ulong *)pGVar5 & 0x4000000000000000;
    }
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManObj(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar4;
      if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        if (((undefined1  [12])pGVar4[-(uVar9 & 0x1fffffff)] & (undefined1  [12])0x4000000040000000)
            == (undefined1  [12])0x0) {
          __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
        }
        uVar6 = *(ulong *)(pGVar4 + -(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff)) &
                0x4000000040000000;
        if (uVar6 == 0) {
          __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
        }
        iVar2 = Gia_ObjTerSimGet0Fanin0(pGVar4);
        if (iVar2 == 0) {
          uVar7 = local_50;
          if ((uVar9 >> 0x3d & 1) == 0) {
            uVar7 = 0x40000000;
          }
          if (uVar6 == uVar7) goto LAB_0045b561;
          iVar2 = Gia_ObjTerSimGet1Fanin0(pGVar4);
          uVar7 = 0x40000000;
          if ((uVar9 >> 0x3d & 1) == 0) {
            uVar7 = local_50;
          }
          if ((uVar6 == uVar7) && (iVar2 != 0)) {
            uVar9 = (uVar9 & 0xbfffffff3fffffff) + 0x4000000000000000;
          }
          else {
            uVar9 = uVar9 | 0x4000000040000000;
          }
        }
        else {
LAB_0045b561:
          uVar9 = uVar9 & 0xbfffffff3fffffff | 0x40000000;
        }
        *(ulong *)pGVar4 = uVar9;
      }
    }
    for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManCo(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar4;
      if ((-1 < (int)(uint)uVar9) || (uVar8 = (uint)uVar9 & 0x1fffffff, uVar8 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
      }
      if (((undefined1  [12])pGVar4[-(ulong)uVar8] & (undefined1  [12])0x4000000040000000) ==
          (undefined1  [12])0x0) {
        __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
      }
      iVar2 = Gia_ObjTerSimGet0Fanin0(pGVar4);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjTerSimGet1Fanin0(pGVar4);
        if (iVar2 == 0) {
          uVar9 = uVar9 | 0x4000000040000000;
        }
        else {
          uVar9 = (uVar9 & 0xbfffffffbfffffff) + 0x4000000000000000;
        }
      }
      else {
        uVar9 = uVar9 & 0xbfffffffbfffffff | 0x40000000;
      }
      *(ulong *)pGVar4 = uVar9;
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int Bmc_CexVerify( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Gia_Obj_t * pObj;
    int i, k;
//    assert( pCex->nRegs > 0 );
//    assert( pCexCare->nRegs == 0 );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    return Gia_ObjTerSimGet1(pObj);
}